

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer_n.c
# Opt level: O0

void dump_scope(TextBuffer *buf,Scope *scope,int level)

{
  int level_local;
  Scope *scope_local;
  TextBuffer *buf_local;
  
  printf_buf(buf,"%pScope {\n",(ulong)(uint)level);
  printf_buf(buf,"%pscope_id = %P,\n",(ulong)(level + 1),scope);
  printf_buf(buf,"%pfunction_id = %P,\n",(ulong)(level + 1),scope->function);
  printf_buf(buf,"%pparent_scope_id = %P,\n",(ulong)(level + 1),scope->parent);
  printf_buf(buf,"%psymbols = {\n",(ulong)(level + 1));
  dump_symbol_list(buf,scope->symbol_list,level + 2,",");
  printf_buf(buf,"%p},\n",(ulong)(level + 1));
  printf_buf(buf,"%pneed_close = %b,\n",(ulong)(level + 1),(ulong)(scope->field_0x18 & 1));
  printf_buf(buf,"%p}\n",(ulong)(uint)level);
  return;
}

Assistant:

static void dump_scope(TextBuffer *buf, Scope *scope, int level)
{
	printf_buf(buf, "%pScope {\n", level);
	printf_buf(buf, "%pscope_id = %P,\n", level + 1, scope);
	printf_buf(buf, "%pfunction_id = %P,\n", level + 1, scope->function);
	printf_buf(buf, "%pparent_scope_id = %P,\n", level + 1, scope->parent);
	printf_buf(buf, "%psymbols = {\n", level + 1);
	dump_symbol_list(buf, scope->symbol_list, level + 2, ",");
	printf_buf(buf, "%p},\n", level + 1);
	printf_buf(buf, "%pneed_close = %b,\n", level + 1, (lua_Integer)scope->need_close);
	printf_buf(buf, "%p}\n", level);
}